

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench_ecmult.c
# Opt level: O2

void bench_ecmult_1p_g(void *arg,int iters)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  
  lVar3 = 0;
  for (lVar2 = 0; lVar2 < iters / 2; lVar2 = lVar2 + 1) {
    uVar1 = *(int *)((long)arg + 0x50) + (int)lVar2 & 0x7fff;
    secp256k1_ecmult((secp256k1_gej *)(*(long *)((long)arg + 0x60) + lVar3),
                     (secp256k1_gej *)((ulong)(uVar1 << 7) + *(long *)((long)arg + 0x20)),
                     (secp256k1_scalar *)
                     ((ulong)((*(int *)((long)arg + 0x58) + (int)lVar2 & 0x7fffU) << 5) +
                     *(long *)((long)arg + 0x10)),
                     (secp256k1_scalar *)((ulong)(uVar1 << 5) + *(long *)((long)arg + 0x10)));
    lVar3 = lVar3 + 0x80;
  }
  return;
}

Assistant:

static void bench_ecmult_1p_g(void* arg, int iters) {
    bench_data* data = (bench_data*)arg;
    int i;

    for (i = 0; i < iters/2; ++i) {
        secp256k1_ecmult(&data->output[i], &data->pubkeys_gej[(data->offset1+i) % POINTS], &data->scalars[(data->offset2+i) % POINTS], &data->scalars[(data->offset1+i) % POINTS]);
    }
}